

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void VP8LHistogramAddSinglePixOrCopy
               (VP8LHistogram *histo,PixOrCopy *v,_func_int_int_int *distance_modifier,
               int distance_modifier_arg0)

{
  uint32_t distance;
  int extra_bits;
  int code;
  int local_30;
  int local_2c;
  
  if (v->mode == '\x01') {
    histo->literal_[(int)(v->argb_or_distance + 0x118)] =
         histo->literal_[(int)(v->argb_or_distance + 0x118)] + 1;
  }
  else if (v->mode == '\0') {
    histo->alpha_[*(byte *)((long)&v->argb_or_distance + 3)] =
         histo->alpha_[*(byte *)((long)&v->argb_or_distance + 3)] + 1;
    histo->red_[*(byte *)((long)&v->argb_or_distance + 2)] =
         histo->red_[*(byte *)((long)&v->argb_or_distance + 2)] + 1;
    histo->literal_[*(byte *)((long)&v->argb_or_distance + 1)] =
         histo->literal_[*(byte *)((long)&v->argb_or_distance + 1)] + 1;
    histo->blue_[(byte)v->argb_or_distance] = histo->blue_[(byte)v->argb_or_distance] + 1;
  }
  else {
    VP8LPrefixEncodeBits((uint)v->len,&local_2c,&local_30);
    histo->literal_[(long)local_2c + 0x100] = histo->literal_[(long)local_2c + 0x100] + 1;
    distance = v->argb_or_distance;
    if (distance_modifier != (_func_int_int_int *)0x0) {
      distance = (*distance_modifier)(distance_modifier_arg0,distance);
    }
    VP8LPrefixEncodeBits(distance,&local_2c,&local_30);
    histo->distance_[local_2c] = histo->distance_[local_2c] + 1;
  }
  return;
}

Assistant:

void VP8LHistogramAddSinglePixOrCopy(VP8LHistogram* const histo,
                                     const PixOrCopy* const v,
                                     int (*const distance_modifier)(int, int),
                                     int distance_modifier_arg0) {
  if (PixOrCopyIsLiteral(v)) {
    ++histo->alpha_[PixOrCopyLiteral(v, 3)];
    ++histo->red_[PixOrCopyLiteral(v, 2)];
    ++histo->literal_[PixOrCopyLiteral(v, 1)];
    ++histo->blue_[PixOrCopyLiteral(v, 0)];
  } else if (PixOrCopyIsCacheIdx(v)) {
    const int literal_ix =
        NUM_LITERAL_CODES + NUM_LENGTH_CODES + PixOrCopyCacheIdx(v);
    assert(histo->palette_code_bits_ != 0);
    ++histo->literal_[literal_ix];
  } else {
    int code, extra_bits;
    VP8LPrefixEncodeBits(PixOrCopyLength(v), &code, &extra_bits);
    ++histo->literal_[NUM_LITERAL_CODES + code];
    if (distance_modifier == NULL) {
      VP8LPrefixEncodeBits(PixOrCopyDistance(v), &code, &extra_bits);
    } else {
      VP8LPrefixEncodeBits(
          distance_modifier(distance_modifier_arg0, PixOrCopyDistance(v)),
          &code, &extra_bits);
    }
    ++histo->distance_[code];
  }
}